

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_column_mapper.cpp
# Opt level: O1

bool duckdb::IsTriviallyMappable
               (MultiFileColumnDefinition *global_column,
               vector<duckdb::MultiFileColumnDefinition,_true> *param_2,ColumnMapper *mapper,
               optional_idx expected_idx)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  idx_t __n;
  idx_t iVar4;
  const_reference pvVar5;
  const_reference global_column_00;
  type mapper_00;
  pointer *__ptr;
  size_type __n_00;
  unique_ptr<duckdb::ColumnMapper,_std::default_delete<duckdb::ColumnMapper>,_true> nested_mapper;
  optional_idx entry;
  _Head_base<0UL,_duckdb::ColumnMapper_*,_false> local_58;
  optional_idx local_50;
  vector<duckdb::MultiFileColumnDefinition,_true> *local_48;
  optional_idx local_40;
  optional_idx local_38;
  
  local_50.index = expected_idx.index;
  iVar3 = (*mapper->_vptr_ColumnMapper[3])(mapper,global_column);
  local_38.index = CONCAT44(extraout_var,iVar3);
  if ((local_38.index != 0xffffffffffffffff) &&
     ((__n = optional_idx::GetIndex(&local_38), local_50.index == 0xffffffffffffffff ||
      (iVar4 = optional_idx::GetIndex(&local_50), __n == iVar4)))) {
    pvVar5 = vector<duckdb::MultiFileColumnDefinition,_true>::operator[](param_2,__n);
    bVar1 = LogicalType::operator==(&pvVar5->type,&global_column->type);
    if ((bVar1) &&
       ((long)(pvVar5->children).
              super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
              .
              super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(pvVar5->children).
              super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
              .
              super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
              ._M_impl.super__Vector_impl_data._M_start ==
        (long)(global_column->children).
              super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
              .
              super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(global_column->children).
              super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
              .
              super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
              ._M_impl.super__Vector_impl_data._M_start)) {
      (*mapper->_vptr_ColumnMapper[2])(&local_58,mapper,&pvVar5->children);
      bVar1 = (global_column->children).
              super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
              .
              super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              (global_column->children).
              super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
              .
              super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
              ._M_impl.super__Vector_impl_data._M_start;
      if (!bVar1) {
        local_48 = &global_column->children;
        __n_00 = 0;
        do {
          global_column_00 =
               vector<duckdb::MultiFileColumnDefinition,_true>::operator[](local_48,__n_00);
          mapper_00 = unique_ptr<duckdb::ColumnMapper,_std::default_delete<duckdb::ColumnMapper>,_true>
                      ::operator*((unique_ptr<duckdb::ColumnMapper,_std::default_delete<duckdb::ColumnMapper>,_true>
                                   *)&local_58);
          optional_idx::optional_idx(&local_40,__n_00);
          bVar2 = IsTriviallyMappable(global_column_00,&pvVar5->children,mapper_00,local_40);
          if (!bVar2) break;
          __n_00 = __n_00 + 1;
          bVar2 = __n_00 < (ulong)(((long)(global_column->children).
                                          super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                                          .
                                          super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(global_column->children).
                                          super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                                          .
                                          super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                  -0x79435e50d79435e5);
          bVar1 = !bVar2;
        } while (bVar2);
      }
      if (local_58._M_head_impl == (ColumnMapper *)0x0) {
        return bVar1;
      }
      (*(local_58._M_head_impl)->_vptr_ColumnMapper[1])();
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool IsTriviallyMappable(const MultiFileColumnDefinition &global_column,
                         const vector<MultiFileColumnDefinition> &local_columns, const ColumnMapper &mapper,
                         optional_idx expected_idx = optional_idx()) {
	auto entry = mapper.Find(global_column);
	if (!entry.IsValid()) {
		return false;
	}
	auto local_id = entry.GetIndex();
	if (expected_idx.IsValid() && local_id != expected_idx.GetIndex()) {
		return false;
	}
	auto &local_column = local_columns[local_id];
	if (local_column.type != global_column.type) {
		return false;
	}
	if (local_column.children.size() != global_column.children.size()) {
		// child count difference - cannot map trivially
		return false;
	}
	auto nested_mapper = mapper.Create(local_column.children);
	for (idx_t i = 0; i < global_column.children.size(); i++) {
		auto &global_child = global_column.children[i];
		bool trivially_mappable = IsTriviallyMappable(global_child, local_column.children, *nested_mapper, i);
		if (!trivially_mappable) {
			return false;
		}
	}
	return true;
}